

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

TadsListener * TadsListener::launch(char *hostname,ushort portno,TadsListenerThread *thread)

{
  int iVar1;
  CVmWeakRefable *this;
  TadsListenerThread *in_RDX;
  ushort in_SI;
  char *in_RDI;
  OS_Listener *l;
  CVmWeakRefable *this_00;
  TadsListenerThread *in_stack_ffffffffffffffc8;
  TadsListener *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  this = (CVmWeakRefable *)operator_new(0x40);
  OS_Listener::OS_Listener((OS_Listener *)this);
  this_00 = this;
  iVar1 = OS_Listener::open((OS_Listener *)this,in_RDI,(uint)in_SI);
  if (iVar1 == 0) {
    CVmRefCntObj::release_ref(&this_00->super_CVmRefCntObj);
    local_8 = (TadsListener *)0x0;
  }
  else {
    OS_CoreSocket::set_non_blocking((OS_CoreSocket *)in_RDX);
    TadsListenerThread::set_port(in_RDX,(OS_Listener *)this);
    iVar1 = OS_Thread::launch(&in_stack_ffffffffffffffc8->super_OS_Thread);
    if (iVar1 == 0) {
      CVmWeakRefable::release_ref(this_00);
      local_8 = (TadsListener *)0x0;
    }
    else {
      local_8 = (TadsListener *)operator_new(0x18);
      TadsListener(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return local_8;
}

Assistant:

TadsListener *TadsListener::launch(const char *hostname, ushort portno,
                                   TadsListenerThread *thread)
{
    /* open the network port */
    OS_Listener *l = new OS_Listener();
    if (!l->open(hostname, portno))
    {
        /* couldn't open the port - delete the listener and return failure */
        l->release_ref();
        return 0;
    }

    /* put the port into non-blocking mode */
    l->set_non_blocking();

    /* hand the network port over to the thread - it assumes our reference */
    thread->set_port(l);

    /* launch the listener thread */
    if (!thread->launch())
    {
        /* couldn't launch the thread - delete it and return failure */
        thread->release_ref();
        return 0;
    }

    /* return the new listener object */
    return new TadsListener(thread);
}